

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_instance.c
# Opt level: O1

apx_portInstance_t *
apx_portInstance_new
          (apx_nodeInstance_tag *parent,apx_portType_t port_type,apx_portId_t port_id,char *name,
          apx_program_t *pack_program,apx_program_t *unpack_program)

{
  apx_portInstance_t *__ptr;
  char *pcVar1;
  
  __ptr = (apx_portInstance_t *)malloc(0x58);
  if (__ptr != (apx_portInstance_t *)0x0) {
    __ptr->parent = parent;
    __ptr->port_type = port_type;
    __ptr->port_id = port_id;
    __ptr->pack_program = pack_program;
    __ptr->unpack_program = unpack_program;
    __ptr->effective_data_element = (apx_dataElement_t *)0x0;
    __ptr->data_offset = 0;
    __ptr->data_size = 0;
    __ptr->queue_length = 0;
    __ptr->element_size = 0;
    __ptr->has_dynamic_data = false;
    __ptr->computation_list = (apx_computationList_t *)0x0;
    __ptr->port_signature = (char *)0x0;
    if (name == (char *)0x0) {
      return __ptr;
    }
    pcVar1 = strdup(name);
    __ptr->name = pcVar1;
    if (pcVar1 != (char *)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (apx_portInstance_t *)0x0;
}

Assistant:

apx_portInstance_t* apx_portInstance_new(struct apx_nodeInstance_tag* parent, apx_portType_t port_type, apx_portId_t port_id,
   char const* name, apx_program_t const* pack_program, apx_program_t const* unpack_program)
{
   apx_portInstance_t* self = (apx_portInstance_t*)malloc(sizeof(apx_portInstance_t));
   if (self != NULL)
   {
      apx_error_t rc = apx_portInstance_create(self, parent, port_type, port_id, name, pack_program, unpack_program);
      if (rc != APX_NO_ERROR)
      {
         free(self);
         self = NULL;
      }
   }
   return self;
}